

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O1

HaI32 QuickSortVertices(HaF64 *vertList,HaI32 stride,HaI32 compareCount,HaI32 vertexCount,
                       HaF64 tolerance)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  HaI32 HVar7;
  uint uVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int vertexCount_00;
  ulong uVar18;
  long lVar19;
  HaF64 *pHVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 in_XMM10_Qb;
  
  uVar18 = (ulong)(uint)stride;
  if (vertexCount < 0x18001) {
    HVar7 = SortVertices(vertList,stride,compareCount,vertexCount,tolerance);
    return HVar7;
  }
  lVar11 = (long)stride;
  pdVar13 = (double *)(vertList + 4);
  lVar1 = lVar11 * 8;
  dVar23 = 0.0;
  dVar22 = 0.0;
  dVar21 = 0.0;
  auVar24 = ZEXT816(0) << 0x40;
  auVar25 = ZEXT816(0) << 0x40;
  auVar26 = ZEXT816(0) << 0x40;
  uVar10 = (ulong)(uint)vertexCount;
  do {
    auVar27._8_8_ = 0;
    auVar27._0_8_ = pdVar13[-2];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = pdVar13[-1];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *pdVar13;
    dVar23 = dVar23 + pdVar13[-2];
    dVar22 = dVar22 + pdVar13[-1];
    dVar21 = *pdVar13 + dVar21;
    auVar24 = vfmadd231sd_fma(auVar24,auVar27,auVar27);
    auVar26 = vfmadd231sd_fma(auVar26,auVar29,auVar29);
    auVar25 = vfmadd231sd_fma(auVar25,auVar33,auVar33);
    pdVar13 = pdVar13 + lVar11;
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
  auVar28._0_8_ = (double)vertexCount;
  auVar28._8_8_ = in_XMM10_Qb;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar23 * dVar23;
  auVar24 = vfmsub213sd_fma(auVar24,auVar28,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar22 * dVar22;
  auVar26 = vfmsub213sd_fma(auVar26,auVar28,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar21 * dVar21;
  auVar25 = vfmsub213sd_fma(auVar25,auVar28,auVar32);
  uVar2 = vcmppd_avx512vl(auVar25,auVar26,1);
  uVar10 = vcmppd_avx512vl(auVar24,auVar26,1);
  uVar10 = ((byte)uVar2 & 3) & uVar10;
  bVar4 = (byte)uVar10;
  uVar2 = vcmppd_avx512vl(auVar24,auVar25,1);
  uVar3 = vcmppd_avx512vl(auVar26,auVar25,1);
  bVar9 = (bool)((byte)uVar2 & 3 & (byte)uVar3 & 1);
  uVar12 = 4;
  if (bVar9 == false) {
    uVar12 = (ulong)((uint)uVar10 & 1 | 2);
  }
  dVar23 = (double)((ulong)bVar9 * (long)dVar21 +
                   (ulong)!bVar9 *
                   ((ulong)(bVar4 & 1) * (long)dVar22 + (ulong)!(bool)(bVar4 & 1) * (long)dVar23)) /
           auVar28._0_8_;
  iVar5 = vertexCount + -1;
  vertexCount_00 = 0;
  do {
    lVar15 = (long)vertexCount_00;
    lVar17 = lVar15 + -1;
    pdVar13 = (double *)((long)vertList + lVar1 * lVar15 + uVar12 * 8);
    lVar15 = (lVar15 * 8 + 0x7fffffff8) * lVar11;
    iVar16 = vertexCount_00;
    do {
      vertexCount_00 = iVar16;
      lVar17 = lVar17 + 1;
      iVar16 = vertexCount_00 + 1;
      lVar15 = lVar15 + uVar18 * 8;
      dVar22 = *pdVar13;
      pdVar13 = pdVar13 + lVar11;
    } while (dVar22 < dVar23);
    lVar14 = (long)iVar5;
    lVar19 = lVar14 + 1;
    pdVar13 = (double *)((long)vertList + lVar1 * lVar14 + uVar12 * 8);
    lVar14 = (lVar14 * 8 + 8) * lVar11;
    iVar6 = iVar5;
    do {
      iVar5 = iVar6;
      dVar22 = *pdVar13;
      lVar19 = lVar19 + -1;
      iVar6 = iVar5 + -1;
      pdVar13 = pdVar13 + -lVar11;
      lVar14 = lVar14 + uVar18 * -8;
    } while (dVar23 < dVar22);
    if ((lVar17 <= lVar19) && (iVar5 = iVar6, vertexCount_00 = iVar16, 0 < stride)) {
      lVar17 = lVar14 * 0x20000000 >> 0x1d;
      lVar15 = lVar15 * 0x20000000 >> 0x1d;
      uVar10 = 0;
      do {
        uVar2 = *(undefined8 *)((long)vertList + uVar10 * 8 + lVar15);
        *(undefined8 *)((long)vertList + uVar10 * 8 + lVar15) =
             *(undefined8 *)((long)vertList + uVar10 * 8 + lVar17);
        *(undefined8 *)((long)vertList + uVar10 * 8 + lVar17) = uVar2;
        uVar10 = uVar10 + 1;
      } while (uVar18 != uVar10);
    }
  } while (vertexCount_00 <= iVar5);
  if (vertexCount - vertexCount_00 == 0 || vertexCount < vertexCount_00) {
    __assert_fail("i0 < vertexCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                  ,0x133,
                  "hacd::HaI32 QuickSortVertices(hacd::HaF64 *const, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaF64)"
                 );
  }
  HVar7 = QuickSortVertices(vertList,stride,compareCount,vertexCount_00,tolerance);
  uVar8 = QuickSortVertices(vertList + vertexCount_00 * stride,stride,compareCount,
                            vertexCount - vertexCount_00,tolerance);
  lVar17 = (long)vertexCount_00;
  if (0 < (int)uVar8) {
    pHVar20 = vertList + 2;
    uVar18 = (ulong)uVar8;
    do {
      memcpy(pHVar20 + HVar7 * lVar11,(HaF64 *)((long)pHVar20 + lVar1 * lVar17),
             (ulong)(stride - 2) << 3);
      pHVar20 = pHVar20 + lVar11;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  if (vertexCount_00 < vertexCount) {
    pdVar13 = (double *)((long)vertList + lVar1 * lVar17);
    lVar17 = (ulong)(uint)vertexCount - lVar17;
    do {
      *pdVar13 = (double)HVar7 + *pdVar13;
      pdVar13 = pdVar13 + lVar11;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  return uVar8 + HVar7;
}

Assistant:

static hacd::HaI32 QuickSortVertices (hacd::HaF64* const vertList, hacd::HaI32 stride, hacd::HaI32 compareCount, hacd::HaI32 vertexCount, hacd::HaF64 tolerance)
	{
		hacd::HaI32 count = 0;
		if (vertexCount > (3 * 1024 * 32)) {
		hacd::HaF64 x = hacd::HaF32 (0.0f);
		hacd::HaF64 y = hacd::HaF32 (0.0f);
		hacd::HaF64 z = hacd::HaF32 (0.0f);
		hacd::HaF64 xd = hacd::HaF32 (0.0f);
		hacd::HaF64 yd = hacd::HaF32 (0.0f);
		hacd::HaF64 zd = hacd::HaF32 (0.0f);
			
			for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
			hacd::HaF64 x0 = vertList[i * stride + 2];
			hacd::HaF64 y0 = vertList[i * stride + 3];
			hacd::HaF64 z0 = vertList[i * stride + 4];
				x += x0;
				y += y0;
				z += z0;
				xd += x0 * x0;
				yd += y0 * y0;
				zd += z0 * z0;
			}

			xd = vertexCount * xd - x * x;
			yd = vertexCount * yd - y * y;
			zd = vertexCount * zd - z * z;

			hacd::HaI32 axis = 2;
		        hacd::HaF64 axisVal = x / vertexCount;
			if ((yd > xd) && (yd > zd)) {
				axis = 3;
				axisVal = y / vertexCount;
			}
			if ((zd > xd) && (zd > yd)) {
				axis = 4;
				axisVal = z / vertexCount;
			}

			hacd::HaI32 i0 = 0;
			hacd::HaI32 i1 = vertexCount - 1;
			do {    
				for ( ;vertList[i0 * stride + axis] < axisVal; i0 ++); 
				for ( ;vertList[i1 * stride + axis] > axisVal; i1 --);
				if (i0 <= i1) {
					for (hacd::HaI32 i = 0; i < stride; i ++) {
						Swap (vertList[i0 * stride + i], vertList[i1 * stride + i]);
					}
					i0 ++; 
					i1 --;
				}
			} while (i0 <= i1);
			HACD_ASSERT (i0 < vertexCount);

		hacd::HaI32 count0 = QuickSortVertices (&vertList[ 0 * stride], stride, compareCount, i0, tolerance);
		hacd::HaI32 count1 = QuickSortVertices (&vertList[i0 * stride], stride, compareCount, vertexCount - i0, tolerance);
			
			count = count0 + count1;

			for (hacd::HaI32 i = 0; i < count1; i ++) {
			memcpy (&vertList[(count0 + i) * stride + 2], &vertList[(i0 + i) * stride + 2], (stride - 2) * sizeof (hacd::HaF64));
			}


//		hacd::HaF64* const indexPtr = (hacd::HaI64*)vertList;
			for (hacd::HaI32 i = i0; i < vertexCount; i ++) {
//			indexPtr[i * stride] += count0;
			vertList[i * stride] += hacd::HaF64 (count0);
			}

		} else {
		count = SortVertices (vertList, stride, compareCount, vertexCount, tolerance);
		}

		return count;
	}